

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O0

Sexp * __thiscall GcHeap::GcHeapImpl::Copy(GcHeapImpl *this,Sexp *from_ref)

{
  undefined4 uVar1;
  mapped_type pSVar2;
  mapped_type *ppSVar3;
  mapped_type local_20;
  Sexp *to_ref;
  Sexp *from_ref_local;
  GcHeapImpl *this_local;
  
  local_20 = (mapped_type)this->free;
  this->free = this->free + 0x20;
  to_ref = from_ref;
  from_ref_local = (Sexp *)this;
  DebugLog("[%d] relocating: %p -> %p",this->gc_number,from_ref,local_20);
  if (to_ref->padding == 0xabababababababab) {
    __assert_fail("from_ref->padding != 0xabababababababab && \"relocating an invalid object\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                  ,0x156,"Sexp *GcHeap::GcHeapImpl::Copy(Sexp *)");
  }
  uVar1 = *(undefined4 *)&to_ref->field_0x4;
  local_20->kind = to_ref->kind;
  *(undefined4 *)&local_20->field_0x4 = uVar1;
  (local_20->field_1).cons.car = (to_ref->field_1).cons.car;
  (local_20->field_1).cons.cdr = (to_ref->field_1).cons.cdr;
  local_20->padding = to_ref->padding;
  memset(to_ref,0xab,0x20);
  pSVar2 = local_20;
  ppSVar3 = std::
            unordered_map<Sexp_*,_Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>_>
            ::operator[](&this->forwarding_addresses,&to_ref);
  *ppSVar3 = pSVar2;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::push_back(&this->worklist,&local_20);
  return local_20;
}

Assistant:

Sexp *Copy(Sexp *from_ref) {
    Sexp *to_ref = (Sexp *)free;
    free += sizeof(Sexp);
    // this copy is guaranteed not to overlap since it
    // doesn't cross the fromspace/tospace boundary.
    DebugLog("[%d] relocating: %p -> %p", gc_number, from_ref, to_ref);
#ifdef DEBUG
    assert(from_ref->padding != 0xabababababababab &&
           "relocating an invalid object");
#endif
    memcpy(to_ref, from_ref, sizeof(Sexp));

#ifdef DEBUG
    // use a distinct bit pattern to ensure that
    // we insta-crash on a GC hole.
    memset(from_ref, 0xAB, sizeof(Sexp));
#endif

    forwarding_addresses[from_ref] = to_ref;
    worklist.push_back(to_ref);
    return to_ref;
  }